

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

int raplcap_pd_is_constraint_supported
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_constraint constraint
              )

{
  int iVar1;
  raplcap_msr *ctx;
  int *piVar2;
  
  ctx = get_state(rc,pkg,die);
  if (ctx != (raplcap_msr *)0x0) {
    if (constraint < (RAPLCAP_CONSTRAINT_PEAK_POWER|RAPLCAP_CONSTRAINT_SHORT_TERM)) {
      iVar1 = msr_is_constraint_supported(&ctx->ctx,zone,constraint);
      return iVar1;
    }
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return -1;
}

Assistant:

int raplcap_pd_is_constraint_supported(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                                       raplcap_constraint constraint) {
  const raplcap_msr* state = get_state(rc, pkg, die);
  int ret;
  if (state == NULL) {
    return -1;
  }
  if ((int) constraint < 0 || (int) constraint >= RAPLCAP_NCONSTRAINTS) {
    errno = EINVAL;
    return -1;
  }
  ret = msr_is_constraint_supported(&state->ctx, zone, constraint);
  raplcap_log(DEBUG,
              "raplcap_pd_is_constraint_supported: pkg=%"PRIu32", die=%"PRIu32", zone=%d, constraint=%d, supported=%d\n",
              pkg, die, zone, constraint, ret);
  return ret;
}